

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O3

int32_t __thiscall
charls::
jls_codec<charls::default_traits<unsigned_short,_charls::triplet<unsigned_short>_>,_charls::decoder_strategy>
::do_run_mode(jls_codec<charls::default_traits<unsigned_short,_charls::triplet<unsigned_short>_>,_charls::decoder_strategy>
              *this,int32_t start_index,decoder_strategy *param_2)

{
  pixel_type *ppVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  pixel_type *ppVar4;
  int32_t iVar5;
  triplet<unsigned_short> tVar6;
  int iVar7;
  triplet<unsigned_short> rb;
  uint uVar8;
  
  ppVar1 = this->current_line_ + start_index;
  tVar6.field_0 = ppVar1[-1].field_0;
  tVar6.field_1 = ppVar1[-1].field_1;
  tVar6.field_2 = ppVar1[-1].field_2;
  iVar5 = decode_run_pixels(this,tVar6,ppVar1,this->width_ - start_index);
  uVar8 = start_index + iVar5;
  if (uVar8 != this->width_) {
    ppVar1 = this->previous_line_ + uVar8;
    uVar2 = ppVar1->field_0;
    uVar3 = ppVar1->field_1;
    rb.field_1 = (anon_union_2_2_7f9ecc14_for_triplet<unsigned_short>_3)uVar3;
    rb.field_0 = (anon_union_2_2_7f9ecd68_for_triplet<unsigned_short>_1)uVar2;
    rb.field_2.v3 = this->previous_line_[uVar8].field_2.v3;
    tVar6 = decode_run_interruption_pixel(this,tVar6,rb);
    ppVar4 = this->current_line_;
    ppVar1 = ppVar4 + uVar8;
    ppVar1->field_0 = (anon_union_2_2_7f9ecd68_for_triplet<unsigned_short>_1)(short)tVar6._0_4_;
    ppVar1->field_1 =
         (anon_union_2_2_7f9ecc14_for_triplet<unsigned_short>_3)(short)((uint)tVar6._0_4_ >> 0x10);
    ppVar4[uVar8].field_2.v3 = (unsigned_short)tVar6.field_2;
    iVar7 = 1;
    if (1 < this->run_index_) {
      iVar7 = this->run_index_;
    }
    this->run_index_ = iVar7 + -1;
    iVar5 = iVar5 + 1;
  }
  return iVar5;
}

Assistant:

int32_t do_run_mode(const int32_t start_index, decoder_strategy* /*template_selector*/)
    {
        const pixel_type ra{current_line_[start_index - 1]};

        const int32_t run_length{decode_run_pixels(ra, current_line_ + start_index, width_ - start_index)};
        const uint32_t end_index{static_cast<uint32_t>(start_index + run_length)};

        if (end_index == width_)
            return end_index - start_index;

        // run interruption
        const pixel_type rb{previous_line_[end_index]};
        current_line_[end_index] = decode_run_interruption_pixel(ra, rb);
        decrement_run_index();
        return end_index - start_index + 1;
    }